

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O0

void __thiscall OpenMD::MAW::calcForce(MAW *this,InteractionData *idat)

{
  reference pvVar1;
  reference this_00;
  double *pdVar2;
  RectMatrix<double,_3U,_3U> *m;
  int *in_RSI;
  long in_RDI;
  double dVar3;
  Vector<double,_3U> *pVVar4;
  Vector3d flab;
  Vector3d ftmp;
  Vector3d trq;
  Vector3d dVangdu;
  Vector3d dvdr;
  Vector3d dVangdr;
  Vector3d dVmorsedr;
  RealType pot_temp;
  RealType Vang;
  RealType Vmorse;
  RealType r4;
  RealType r3;
  RealType z2;
  RealType x2;
  RealType z;
  RealType y;
  RealType x;
  RealType expfnc2C;
  RealType expfncC;
  RealType exptC;
  RealType expfnc2;
  RealType expfnc;
  RealType expt;
  RotMat3x3d Atrans;
  Vector3d r;
  RealType cb1;
  RealType ca1;
  RealType beta;
  RealType R_e;
  RealType D_e;
  RealType myDerivC;
  RealType myDeriv;
  RealType myPotC;
  RealType myPot;
  MAWInteractionData *mixer;
  SquareMatrix3<double> *in_stack_fffffffffffffb18;
  SquareMatrix3<double> *in_stack_fffffffffffffb20;
  Vector<double,_3U> *in_stack_fffffffffffffb28;
  Vector3<double> *in_stack_fffffffffffffb30;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb38;
  RectMatrix<double,_3U,_3U> *m_00;
  Vector<double,_3U> *in_stack_fffffffffffffb40;
  Vector<double,_3U> *v;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb48;
  SquareMatrix3<double> *in_stack_fffffffffffffb58;
  RectMatrix<double,_3U,_3U> local_480 [7];
  MAW *in_stack_fffffffffffffd80;
  double local_208;
  double local_200;
  RectMatrix<double,_3U,_3U> local_190 [3];
  Vector3<double> local_78;
  RealType local_60;
  RealType local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  reference local_18;
  int *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_fffffffffffffd80);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)*local_10);
  this_00 = std::
            vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                          *)(in_RDI + 0x58),(long)*pvVar1);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_10[1]);
  local_18 = std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::
             operator[](this_00,(long)*pvVar1);
  local_20 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = local_18->De;
  local_48 = local_18->Re;
  local_50 = local_18->beta;
  local_58 = local_18->ca1;
  local_60 = local_18->cb1;
  Vector3<double>::Vector3((Vector3<double> *)0x30a694);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x30a6a1);
  if ((local_18->j_is_Metal & 1U) == 0) {
    OpenMD::operator-(in_stack_fffffffffffffb38);
    OpenMD::operator*(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb28,
               (Vector<double,_3U> *)in_stack_fffffffffffffb20);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_190);
    SquareMatrix3<double>::transpose(in_stack_fffffffffffffb58);
    SquareMatrix3<double>::operator=(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x30a81c);
  }
  else {
    OpenMD::operator*(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb28,
               (Vector<double,_3U> *)in_stack_fffffffffffffb20);
    SquareMatrix3<double>::transpose(in_stack_fffffffffffffb58);
    SquareMatrix3<double>::operator=(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x30a731);
  }
  dVar3 = exp(-local_50 * (*(double *)(local_10 + 8) - local_48));
  local_200 = 0.0;
  local_208 = 0.0;
  local_20 = local_40 * (dVar3 * dVar3 - (dVar3 + dVar3));
  local_30 = local_40 * 2.0 * local_50 * (dVar3 - dVar3 * dVar3);
  if (((*(byte *)(local_10 + 0xe) & 1) != 0) || ((*(byte *)((long)local_10 + 0x39) & 1) != 0)) {
    local_200 = exp(-local_50 * (*(double *)(local_10 + 0xc) - local_48));
    local_208 = local_200 * local_200;
  }
  if ((*(byte *)(local_10 + 0xe) & 1) == 0) {
    if ((*(byte *)((long)local_10 + 0x39) & 1) == 0) {
      local_28 = 0.0;
      local_38 = 0.0;
    }
    else {
      local_38 = local_40 * 2.0 * local_50 * (local_200 - local_208);
      local_28 = local_38 * (*(double *)(local_10 + 8) - *(double *)(local_10 + 0xc)) +
                 local_40 * (local_208 - (local_200 + local_200));
    }
  }
  else {
    local_28 = local_40 * (local_208 - (local_200 + local_200));
    local_38 = 0.0;
  }
  pdVar2 = Vector3<double>::x(&local_78);
  dVar3 = *pdVar2;
  Vector3<double>::y(&local_78);
  pdVar2 = Vector3<double>::z(&local_78);
  pVVar4 = (Vector<double,_3U> *)
           (*(double *)(local_10 + 0x14) * (local_20 - local_28) *
           ((local_58 * dVar3 * dVar3) / *(double *)(local_10 + 10) +
            (local_60 * *pdVar2) / *(double *)(local_10 + 8) + local_58 / -3.0 + 0.8));
  *(double *)(local_10 + 0x34) = *(double *)(local_10 + 0x34) + (double)pVVar4;
  m_00 = *(RectMatrix<double,_3U,_3U> **)(local_10 + 0x10);
  v = pVVar4;
  m = (RectMatrix<double,_3U,_3U> *)
      Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x18),1);
  m->data_[0][0] = (double)m_00 * (double)v + m->data_[0][0];
  if ((*(byte *)((long)local_10 + 0xdb) & 1) != 0) {
    in_stack_fffffffffffffb20 = *(SquareMatrix3<double> **)(local_10 + 0x10);
    in_stack_fffffffffffffb30 =
         (Vector3<double> *)
         Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x38),1);
    (in_stack_fffffffffffffb30->super_Vector<double,_3U>).data_[0] =
         (double)in_stack_fffffffffffffb20 * (double)pVVar4 +
         (in_stack_fffffffffffffb30->super_Vector<double,_3U>).data_[0];
    in_stack_fffffffffffffb28 = pVVar4;
  }
  pVVar4 = (Vector<double,_3U> *)(local_30 - local_38);
  Vector3<double>::Vector3
            (in_stack_fffffffffffffb30,(double)in_stack_fffffffffffffb28,
             (double)in_stack_fffffffffffffb20,(double)pVVar4);
  OpenMD::operator*((double)in_stack_fffffffffffffb28,
                    (Vector<double,_3U> *)in_stack_fffffffffffffb20);
  operator/(in_stack_fffffffffffffb28,(double)in_stack_fffffffffffffb20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb20,pVVar4);
  Vector3<double>::Vector3
            (in_stack_fffffffffffffb30,(double)in_stack_fffffffffffffb28,
             (double)in_stack_fffffffffffffb20,(double)pVVar4);
  OpenMD::operator*((double)in_stack_fffffffffffffb28,
                    (Vector<double,_3U> *)in_stack_fffffffffffffb20);
  OpenMD::operator*((double)in_stack_fffffffffffffb28,
                    (Vector<double,_3U> *)in_stack_fffffffffffffb20);
  OpenMD::operator+(in_stack_fffffffffffffb28,(Vector<double,_3U> *)in_stack_fffffffffffffb20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb20,pVVar4);
  Vector3<double>::Vector3
            (in_stack_fffffffffffffb30,(double)in_stack_fffffffffffffb28,
             (double)in_stack_fffffffffffffb20,(double)pVVar4);
  OpenMD::operator*((double)in_stack_fffffffffffffb28,
                    (Vector<double,_3U> *)in_stack_fffffffffffffb20);
  OpenMD::operator*(in_stack_fffffffffffffb28,(double)in_stack_fffffffffffffb20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb20,pVVar4);
  if ((local_18->j_is_Metal & 1U) == 0) {
    OpenMD::operator*(m,v);
    Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_stack_fffffffffffffb20,pVVar4);
  }
  else {
    OpenMD::operator*(m,v);
    Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_stack_fffffffffffffb20,pVVar4);
  }
  OpenMD::operator*((double)in_stack_fffffffffffffb28,
                    (Vector<double,_3U> *)in_stack_fffffffffffffb20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb20,pVVar4);
  Vector3<double>::Vector3((Vector3<double> *)0x30b185);
  if ((local_18->j_is_Metal & 1U) == 0) {
    OpenMD::operator-(m_00);
    OpenMD::operator*(m,v);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb28,
               (Vector<double,_3U> *)in_stack_fffffffffffffb20);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_480);
  }
  else {
    OpenMD::operator*(m,v);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb28,
               (Vector<double,_3U> *)in_stack_fffffffffffffb20);
  }
  Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_stack_fffffffffffffb20,pVVar4);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x30b26b);
  return;
}

Assistant:

void MAW::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MAWInteractionData& mixer =
        MixingMap[MAWtids[idat.atid1]][MAWtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType D_e  = mixer.De;
    RealType R_e  = mixer.Re;
    RealType beta = mixer.beta;
    RealType ca1  = mixer.ca1;
    RealType cb1  = mixer.cb1;

    Vector3d r;
    RotMat3x3d Atrans;
    if (mixer.j_is_Metal) {
      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:
      r      = idat.A1 * idat.d;
      Atrans = idat.A1.transpose();
    } else {
      // negative sign because this is the vector from j to i:
      r      = -idat.A2 * idat.d;
      Atrans = idat.A2.transpose();
    }

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - R_e);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    myPot   = D_e * (expfnc2 - 2.0 * expfnc);
    myDeriv = 2.0 * D_e * beta * (expfnc - expfnc2);

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - R_e);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    if (idat.shiftedPot) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 2.0 * D_e * beta * (expfncC - expfnc2C);
      myPotC += myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType x  = r.x();
    RealType y  = r.y();
    RealType z  = r.z();
    RealType x2 = x * x;
    RealType z2 = z * z;

    RealType r3 = idat.r2 * idat.rij;
    RealType r4 = idat.r2 * idat.r2;

    // angular modulation of morse part of potential to approximate
    // the squares of the two HOMO lone pair orbitals in water:
    //********************** old form*************************
    // s = 1 / (4 pi)
    // ta1 = (s - pz)^2 = (1 - sqrt(3)*cos(theta))^2 / (4 pi)
    // b1 = px^2 = 3 * (sin(theta)*cos(phi))^2 / (4 pi)
    //********************** old form*************************
    // we'll leave out the 4 pi for now

    // new functional form just using the p orbitals.
    // Vmorse(r)*[a*p_x + b p_z + (1-a-b)]
    // which is
    // Vmorse(r)*[a sin^2(theta) cos^2(phi) + b cos(theta) + (1-a-b)]
    // Vmorse(r)*[a*x2/r2 + b*z/r + (1-a-b)]

    RealType Vmorse = (myPot - myPotC);
    RealType Vang = ca1 * x2 / idat.r2 + cb1 * z / idat.rij + (0.8 - ca1 / 3.0);

    RealType pot_temp = idat.vdwMult * Vmorse * Vang;
    idat.vpair += pot_temp;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    Vector3d dVmorsedr = (myDeriv - myDerivC) * Vector3d(x, y, z) / idat.rij;

    Vector3d dVangdr = Vector3d(
        -2.0 * ca1 * x2 * x / r4 + 2.0 * ca1 * x / idat.r2 - cb1 * x * z / r3,
        -2.0 * ca1 * x2 * y / r4 - cb1 * z * y / r3,
        -2.0 * ca1 * x2 * z / r4 + cb1 / idat.rij - cb1 * z2 / r3);

    // chain rule to put these back on x, y, z

    Vector3d dvdr = Vang * dVmorsedr + Vmorse * dVangdr;

    // Torques for Vang using method of Price:
    // S. L. Price, A. J. Stone, and M. Alderton, Mol. Phys. 52, 987 (1984).

    Vector3d dVangdu = Vector3d(
        cb1 * y / idat.rij, 2.0 * ca1 * x * z / idat.r2 - cb1 * x / idat.rij,
        -2.0 * ca1 * y * x / idat.r2);

    // do the torques first since they are easy:
    // remember that these are still in the body fixed axes

    Vector3d trq = idat.vdwMult * Vmorse * dVangdu * idat.sw;

    // go back to lab frame using transpose of rotation matrix:

    if (mixer.j_is_Metal) {
      idat.t1 += Atrans * trq;
    } else {
      idat.t2 += Atrans * trq;
    }

    // Now, on to the forces (still in body frame of water)

    Vector3d ftmp = idat.vdwMult * idat.sw * dvdr;

    // rotate the terms back into the lab frame:
    Vector3d flab;
    if (mixer.j_is_Metal) {
      flab = Atrans * ftmp;
    } else {
      flab = -Atrans * ftmp;
    }

    idat.f1 += flab;

    return;
  }